

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverCountLiterals(Mvc_Cover_t *pCover)

{
  int local_2c;
  int local_28;
  int CounterCur;
  int CounterTot;
  int i;
  int nBit;
  int nWord;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  local_28 = 0;
  for (CounterCur = 0; CounterCur < pCover->nBits; CounterCur = CounterCur + 1) {
    local_2c = 0;
    for (_nBit = (pCover->lCubes).pHead; _nBit != (Mvc_Cube_t *)0x0; _nBit = _nBit->pNext) {
      if ((_nBit->pData[CounterCur >> 5] & 1 << ((byte)CounterCur & 0x1f)) != 0) {
        local_2c = local_2c + 1;
      }
    }
    local_28 = local_2c + local_28;
  }
  return local_28;
}

Assistant:

int Mvc_CoverCountLiterals( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, CounterTot, CounterCur;

    // allocate/clean the storage for literals
//    Mvc_CoverAllocateArrayLits( pCover );
//    memset( pCover->pLits, 0, pCover->nBits * sizeof(int) );
    // go through each literal
    CounterTot = 0;
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // go through all the cubes
        CounterCur = 0;
        Mvc_CoverForEachCube( pCover, pCube )
            if ( pCube->pData[nWord] & (1<<nBit) )
                CounterCur++;
        CounterTot += CounterCur;
    }
    return CounterTot;
}